

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.cpp
# Opt level: O2

Ptr<Semaphore> __thiscall myvk::Semaphore::Create(Semaphore *this,Ptr<Device> *device)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  VkResult VVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<Semaphore> PVar3;
  shared_ptr<myvk::Semaphore> ret;
  VkSemaphoreCreateInfo info;
  _func_int **local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  VkSemaphoreCreateInfo local_38;
  
  std::make_shared<myvk::Semaphore>();
  std::__shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2> *)(local_48 + 3),
             &device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>);
  local_38.flags = 0;
  local_38._20_4_ = 0;
  local_38.pNext = (void *)0x0;
  local_38.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
  local_38._4_4_ = 0;
  VVar2 = (*vkCreateSemaphore)
                    (((device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                     ->m_device,&local_38,(VkAllocationCallbacks *)0x0,(VkSemaphore *)(local_48 + 5)
                    );
  _Var1._M_pi = _Stack_40._M_pi;
  if (VVar2 == VK_SUCCESS) {
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_DeviceObjectBase).super_Base._vptr_Base = local_48;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var1._M_pi;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  PVar3.super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Semaphore>)PVar3.super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Semaphore> Semaphore::Create(const Ptr<Device> &device) {
	auto ret = std::make_shared<Semaphore>();
	ret->m_device_ptr = device;

	VkSemaphoreCreateInfo info = {};
	info.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
	if (vkCreateSemaphore(device->GetHandle(), &info, nullptr, &ret->m_semaphore) != VK_SUCCESS)
		return nullptr;
	return ret;
}